

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmTypeLiteral(ExpressionContext *ctx,VmModule *module,ExprTypeLiteral *node)

{
  TypeBase *type;
  VmValue *pVVar1;
  
  type = node->value;
  if ((type != (TypeBase *)0x0) &&
     ((type->typeID == 0x1a ||
      ((type != (TypeBase *)0x0 &&
       ((type->typeID == 0x1b || ((type != (TypeBase *)0x0 && (type->typeID == 0x1c)))))))))) {
    __assert_fail("!isType<TypeFunctionSet>(node->value) && !isType<TypeArgumentSet>(node->value) && !isType<TypeMemberSet>(node->value)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xa0b,
                  "VmValue *CompileVmTypeLiteral(ExpressionContext &, VmModule *, ExprTypeLiteral *)"
                 );
  }
  pVVar1 = anon_unknown.dwarf_233176::CreateTypeIndex(module,(node->super_ExprBase).source,type);
  pVVar1 = anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmTypeLiteral(ExpressionContext &ctx, VmModule *module, ExprTypeLiteral *node)
{
	assert(!isType<TypeFunctionSet>(node->value) && !isType<TypeArgumentSet>(node->value) && !isType<TypeMemberSet>(node->value));

	return CheckType(ctx, node, CreateTypeIndex(module, node->source, node->value));
}